

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O2

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> __thiscall
duckdb::ArrowType::CreateListType
          (ArrowType *this,DBConfig *config,ArrowSchema *child,ArrowVariableSizeType size_type,
          bool view)

{
  shared_ptr<duckdb::ArrowType,_true> *psVar1;
  pointer this_00;
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> child_type;
  LogicalType type;
  _Head_base<0UL,_duckdb::ArrowTypeInfo_*,_false> local_80;
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> local_78;
  undefined1 local_70 [24];
  shared_ptr<duckdb::ArrowType,_true> local_58;
  shared_ptr<duckdb::ArrowType,_true> local_48;
  LogicalType local_38;
  
  GetArrowLogicalType((ArrowType *)&local_78,config,child);
  local_80._M_head_impl = (ArrowTypeInfo *)0x0;
  this_00 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::operator->
                      ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                        *)&local_78);
  GetDuckType((LogicalType *)local_70,this_00,false);
  LogicalType::LIST(&local_38,(LogicalType *)local_70);
  LogicalType::~LogicalType((LogicalType *)local_70);
  if (view) {
    ::std::__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,void>
              ((__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2> *)&local_48,&local_78);
    ArrowListInfo::ListView((ArrowListInfo *)local_70,&local_48,size_type);
    local_80._M_head_impl = (ArrowTypeInfo *)local_70._0_8_;
    local_70._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    psVar1 = &local_48;
  }
  else {
    ::std::__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,void>
              ((__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2> *)&local_58,&local_78);
    ArrowListInfo::List((ArrowListInfo *)local_70,&local_58,size_type);
    local_80._M_head_impl = (ArrowTypeInfo *)local_70._0_8_;
    psVar1 = &local_58;
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(psVar1->internal).super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  make_uniq<duckdb::ArrowType,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::ArrowTypeInfo,std::default_delete<duckdb::ArrowTypeInfo>,true>>
            ((duckdb *)this,&local_38,
             (unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true> *)
             &local_80);
  LogicalType::~LogicalType(&local_38);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_head_impl !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(local_80._M_head_impl)->_vptr_ArrowTypeInfo[1])();
  }
  ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::~unique_ptr
            (&local_78);
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)this;
}

Assistant:

unique_ptr<ArrowType> ArrowType::CreateListType(DBConfig &config, ArrowSchema &child, ArrowVariableSizeType size_type,
                                                bool view) {
	auto child_type = GetArrowLogicalType(config, child);

	unique_ptr<ArrowTypeInfo> type_info;
	auto type = LogicalType::LIST(child_type->GetDuckType());
	if (view) {
		type_info = ArrowListInfo::ListView(std::move(child_type), size_type);
	} else {
		type_info = ArrowListInfo::List(std::move(child_type), size_type);
	}
	return make_uniq<ArrowType>(type, std::move(type_info));
}